

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ann.cpp
# Opt level: O2

void __thiscall ANN::initialize(ANN *this,double beg,double end)

{
  pointer pLVar1;
  time_t tVar2;
  uint uVar3;
  
  uVar3 = 0;
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  while( true ) {
    pLVar1 = (this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (((long)(this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
               super__Vector_impl_data._M_finish - (long)pLVar1) / 0x58 - 1U <= (ulong)uVar3) break;
    Matrix::random_init(&pLVar1[uVar3].m_weights,beg,end);
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void ANN::initialize(double beg, double end){
    srand(time(0));
    for(uint i=0;i<m_layers.size()-1;++i){
        m_layers[i].weights().random_init(beg, end);
    }
}